

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c219.c
# Opt level: O0

void c219_w(void *chip,UINT16 offset,UINT8 data)

{
  undefined4 *puVar1;
  long lVar2;
  C219_VREGS *vreg;
  C219_VOICE *v;
  c219_state *info;
  UINT8 data_local;
  UINT16 offset_local;
  void *chip_local;
  
  info._6_2_ = offset & 0x1ff;
  if ((0x1f7 < info._6_2_) && ((offset & 1) != 0)) {
    info._6_2_ = offset & 0x1f7;
  }
  *(UINT8 *)((long)chip + (ulong)info._6_2_ + 0x20) = data;
  if ((info._6_2_ < 0x100) &&
     (puVar1 = (undefined4 *)((long)chip + (long)((int)(uint)info._6_2_ >> 4) * 0x1c + 0x424),
     (info._6_2_ & 0xf) == 5)) {
    if ((data & 0x80) == 0) {
      *(undefined1 *)(puVar1 + 6) = 0;
    }
    else {
      lVar2 = (long)(int)(info._6_2_ & 0x1f0);
      puVar1[5] = (uint)CONCAT11(*(undefined1 *)((long)chip + lVar2 + 0x2a),
                                 *(undefined1 *)((long)chip + lVar2 + 0x2b)) << 1;
      puVar1[3] = (uint)CONCAT11(*(undefined1 *)((long)chip + lVar2 + 0x26),
                                 *(undefined1 *)((long)chip + lVar2 + 0x27)) << 1;
      puVar1[4] = (uint)CONCAT11(*(undefined1 *)((long)chip + lVar2 + 0x28),
                                 *(undefined1 *)((long)chip + lVar2 + 0x29)) << 1;
      *(undefined1 *)(puVar1 + 6) = 1;
      *puVar1 = puVar1[3];
      *(undefined2 *)(puVar1 + 1) = 0xffff;
      *(undefined2 *)((long)puVar1 + 6) = 0;
      *(undefined2 *)(puVar1 + 2) = 0;
    }
  }
  return;
}

Assistant:

static void c219_w(void *chip, UINT16 offset, UINT8 data)
{
	c219_state *info = (c219_state *)chip;

	offset&=0x1ff;
	// mirror the bank registers on the 219, fixes bkrtmaq (and probably xday2 based on notes in the HLE)
	if (offset >= 0x1f8 && (offset & 0x001))
		offset &= ~0x008;

	info->REG[offset]=data;
	if (offset < 0x100)
	{
		C219_VOICE *v = &info->voi[offset>>4];

		if ((offset & 0xF) == 0x5)
		{
			if (data & C219_MODE_KEYON)
			{
				const C219_VREGS* vreg = (C219_VREGS*)&info->REG[offset & 0x1F0];

				// on the 219 asic, addresses are in words
				v->sample_loop = ((vreg->loop_msb<<8) | vreg->loop_lsb)*2;
				v->sample_start = ((vreg->start_msb<<8) | vreg->start_lsb)*2;
				v->sample_end = ((vreg->end_msb<<8) | vreg->end_lsb)*2;
				v->key=1;
				v->pos = v->sample_start;
				v->pofs = 0xFFFF;
				v->sample = 0;
				v->last_sample = 0;

				#if 0
				logerror("219: play v %d mode %02x start %x loop %x end %x\n",
					offset>>4, vreg->mode,
					find_sample(info, v->sample_start, v->bank, offset>>4),
					find_sample(info, v->sample_loop, v->bank, offset>>4),
					find_sample(info, v->sample_end, v->bank, offset>>4));
				#endif
			}
			else
			{
				v->key=0;
			}
		}
	}
}